

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

size_t __thiscall SimpleString::count(SimpleString *this,SimpleString *substr)

{
  SimpleString *in_RSI;
  SimpleString *in_RDI;
  char *str;
  size_t num;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  char *local_20;
  size_t local_18;
  
  local_18 = 0;
  local_20 = getBuffer(in_RDI);
  while( true ) {
    uVar1 = false;
    if (*local_20 != '\0') {
      getBuffer(in_RSI);
      local_20 = StrStr((char *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),local_20);
      uVar1 = local_20 != (char *)0x0;
    }
    if ((bool)uVar1 == false) break;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

size_t SimpleString::count(const SimpleString& substr) const
{
    size_t num = 0;
    const char* str = getBuffer();
    while (*str && (str = StrStr(str, substr.getBuffer()))) {
        str++;
        num++;
    }
    return num;
}